

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O3

int uv__io_check_fd(uv_loop_t *loop,int fd)

{
  int iVar1;
  int *piVar2;
  undefined8 local_1c;
  undefined4 local_14;
  
  local_14 = 0;
  local_1c._0_4_ = 1;
  local_1c._4_4_ = 0xffffffff;
  iVar1 = epoll_ctl(loop->backend_fd,1,fd,(epoll_event *)&local_1c);
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    if ((iVar1 != 0x11) && (iVar1 != 0)) {
      return -iVar1;
    }
  }
  iVar1 = epoll_ctl(loop->backend_fd,2,fd,(epoll_event *)&local_1c);
  if (iVar1 == 0) {
    return 0;
  }
  abort();
}

Assistant:

int uv__io_check_fd(uv_loop_t* loop, int fd) {
  struct epoll_event e;
  int rc;

  memset(&e, 0, sizeof(e));
  e.events = POLLIN;
  e.data.fd = -1;

  rc = 0;
  if (epoll_ctl(loop->backend_fd, EPOLL_CTL_ADD, fd, &e))
    if (errno != EEXIST)
      rc = UV__ERR(errno);

  if (rc == 0)
    if (epoll_ctl(loop->backend_fd, EPOLL_CTL_DEL, fd, &e))
      abort();

  return rc;
}